

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void explainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,int iLevel,int iFrom,
                   u16 wctrlFlags)

{
  byte bVar1;
  uint uVar2;
  sqlite3 *db;
  Vdbe *p;
  Index *pIVar3;
  Column *pCVar4;
  int *piVar5;
  sqlite3_index_info *psVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  uint iTerm;
  uint iTerm_00;
  ulong uVar16;
  bool bVar17;
  StrAccum local_58;
  
  if (((pParse->explain != '\x02') || (uVar2 = (pLevel->plan).wsFlags, (uVar2 >> 0x1c & 1) != 0)) ||
     ((wctrlFlags & 0x40) != 0)) {
    return;
  }
  bVar1 = pLevel->iFrom;
  db = pParse->db;
  p = pParse->pVdbe;
  iVar7 = pParse->iSelectId;
  pcVar8 = "SCAN";
  if ((pLevel->plan).nEq != 0) {
    pcVar8 = "SEARCH";
  }
  if ((uVar2 & 0x300000) != 0 || (wctrlFlags & 3) != 0) {
    pcVar8 = "SEARCH";
  }
  pcVar8 = sqlite3MPrintf(db,"%s",pcVar8);
  if (pTabList->a[bVar1].pSelect == (Select *)0x0) {
    pcVar8 = sqlite3MAppendf(db,pcVar8,"%s TABLE %s",pcVar8,pTabList->a[bVar1].zName);
  }
  else {
    pcVar8 = sqlite3MAppendf(db,pcVar8,"%s SUBQUERY %d",pcVar8,(ulong)pTabList->a[bVar1].iSelectId);
  }
  if (pTabList->a[bVar1].zAlias != (char *)0x0) {
    pcVar8 = sqlite3MAppendf(db,pcVar8,"%s AS %s",pcVar8);
  }
  if ((uVar2 & 0xf0000) == 0) {
    if ((uVar2 & 0x3000) == 0) {
      if ((uVar2 >> 0x1b & 1) != 0) {
        psVar6 = (pLevel->plan).u.pVtabIdx;
        pcVar8 = sqlite3MAppendf(db,pcVar8,"%s VIRTUAL TABLE INDEX %d:%s",pcVar8,
                                 (ulong)(uint)psVar6->idxNum,psVar6->idxStr);
      }
    }
    else {
      pcVar8 = sqlite3MAppendf(db,pcVar8,"%s USING INTEGER PRIMARY KEY");
      if ((uVar2 >> 0xc & 1) == 0) {
        if ((uVar2 & 0x300000) == 0x300000) {
          pcVar9 = "%s (rowid>? AND rowid<?)";
        }
        else if ((uVar2 >> 0x15 & 1) == 0) {
          if ((uVar2 >> 0x14 & 1) == 0) goto LAB_0019493d;
          pcVar9 = "%s (rowid<?)";
        }
        else {
          pcVar9 = "%s (rowid>?)";
        }
        pcVar8 = sqlite3MAppendf(db,pcVar8,pcVar9,pcVar8);
      }
      else {
        pcVar8 = sqlite3MAppendf(db,pcVar8,"%s (rowid=?)",pcVar8);
      }
    }
  }
  else {
    pIVar3 = (pLevel->plan).u.pIdx;
    uVar10 = (ulong)(pLevel->plan).nEq;
    pCVar4 = (pTabList->a[bVar1].pTab)->aCol;
    piVar5 = pIVar3->aiColumn;
    if ((uVar10 == 0) && (((pLevel->plan).wsFlags & 0x300000) == 0)) {
      pcVar9 = (char *)0x0;
    }
    else {
      local_58.zBase = (char *)0x0;
      local_58.zText = (char *)0x0;
      local_58.nChar = 0;
      local_58.nAlloc = 0;
      local_58.mxAlloc = 1000000000;
      local_58.tooBig = '\0';
      local_58.mallocFailed = '\0';
      local_58.useMalloc = '\x01';
      local_58.db = db;
      sqlite3StrAccumAppend(&local_58," (",2);
      if (uVar10 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        do {
          explainAppendTerm(&local_58,(int)uVar16,pCVar4[piVar5[uVar16]].zName,"=");
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
      }
      iTerm_00 = (uint)uVar16;
      iTerm = iTerm_00;
      if (((pLevel->plan).wsFlags & 0x200000) != 0) {
        if (iTerm_00 == pIVar3->nColumn) {
          pcVar9 = "rowid";
        }
        else {
          pcVar9 = pCVar4[piVar5[uVar16 & 0xffffffff]].zName;
        }
        iTerm = iTerm_00 + 1;
        explainAppendTerm(&local_58,iTerm_00,pcVar9,">");
      }
      if (((pLevel->plan).wsFlags & 0x100000) != 0) {
        if (iTerm_00 == pIVar3->nColumn) {
          pcVar9 = "rowid";
        }
        else {
          pcVar9 = pCVar4[piVar5[uVar16 & 0xffffffff]].zName;
        }
        explainAppendTerm(&local_58,iTerm,pcVar9,"<");
      }
      sqlite3StrAccumAppend(&local_58,")",1);
      pcVar9 = sqlite3StrAccumFinish(&local_58);
    }
    pcVar14 = "";
    pcVar13 = "COVERING ";
    if ((uVar2 >> 0x16 & 1) == 0) {
      pcVar13 = "";
    }
    pcVar11 = "AUTOMATIC ";
    bVar17 = (uVar2 & 0x20000000) != 0;
    if (!bVar17) {
      pcVar11 = "";
    }
    pcVar15 = " ";
    if (bVar17) {
      pcVar15 = "";
    }
    else {
      pcVar14 = ((pLevel->plan).u.pIdx)->zName;
    }
    pcVar8 = sqlite3MAppendf(db,pcVar8,"%s USING %s%sINDEX%s%s%s",pcVar8,pcVar11,pcVar13,pcVar15,
                             pcVar14,pcVar9);
    sqlite3DbFree(db,pcVar9);
  }
LAB_0019493d:
  lVar12 = 1;
  if ((wctrlFlags & 3) == 0) {
    lVar12 = (long)(pLevel->plan).nRow;
  }
  pcVar8 = sqlite3MAppendf(db,pcVar8,"%s (~%lld rows)",pcVar8,lVar12);
  iVar7 = sqlite3VdbeAddOp3(p,0x96,iVar7,iLevel,iFrom);
  sqlite3VdbeChangeP4(p,iVar7,pcVar8,-1);
  return;
}

Assistant:

static void explainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  int iLevel,                     /* Value for "level" column of output */
  int iFrom,                      /* Value for "from" column of output */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  if( pParse->explain==2 ){
    u32 flags = pLevel->plan.wsFlags;
    struct SrcList_item *pItem = &pTabList->a[pLevel->iFrom];
    Vdbe *v = pParse->pVdbe;      /* VM being constructed */
    sqlite3 *db = pParse->db;     /* Database handle */
    char *zMsg;                   /* Text to add to EQP output */
    sqlite3_int64 nRow;           /* Expected number of rows visited by scan */
    int iId = pParse->iSelectId;  /* Select id (left-most output column) */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */

    if( (flags&WHERE_MULTI_OR) || (wctrlFlags&WHERE_ONETABLE_ONLY) ) return;

    isSearch = (pLevel->plan.nEq>0)
             || (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
             || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    zMsg = sqlite3MPrintf(db, "%s", isSearch?"SEARCH":"SCAN");
    if( pItem->pSelect ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s SUBQUERY %d", zMsg,pItem->iSelectId);
    }else{
      zMsg = sqlite3MAppendf(db, zMsg, "%s TABLE %s", zMsg, pItem->zName);
    }

    if( pItem->zAlias ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s AS %s", zMsg, pItem->zAlias);
    }
    if( (flags & WHERE_INDEXED)!=0 ){
      char *zWhere = explainIndexRange(db, pLevel, pItem->pTab);
      zMsg = sqlite3MAppendf(db, zMsg, "%s USING %s%sINDEX%s%s%s", zMsg, 
          ((flags & WHERE_TEMP_INDEX)?"AUTOMATIC ":""),
          ((flags & WHERE_IDX_ONLY)?"COVERING ":""),
          ((flags & WHERE_TEMP_INDEX)?"":" "),
          ((flags & WHERE_TEMP_INDEX)?"": pLevel->plan.u.pIdx->zName),
          zWhere
      );
      sqlite3DbFree(db, zWhere);
    }else if( flags & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s USING INTEGER PRIMARY KEY", zMsg);

      if( flags&WHERE_ROWID_EQ ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid=?)", zMsg);
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid>? AND rowid<?)", zMsg);
      }else if( flags&WHERE_BTM_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid>?)", zMsg);
      }else if( flags&WHERE_TOP_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid<?)", zMsg);
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_index_info *pVtabIdx = pLevel->plan.u.pVtabIdx;
      zMsg = sqlite3MAppendf(db, zMsg, "%s VIRTUAL TABLE INDEX %d:%s", zMsg,
                  pVtabIdx->idxNum, pVtabIdx->idxStr);
    }
#endif
    if( wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX) ){
      testcase( wctrlFlags & WHERE_ORDERBY_MIN );
      nRow = 1;
    }else{
      nRow = (sqlite3_int64)pLevel->plan.nRow;
    }
    zMsg = sqlite3MAppendf(db, zMsg, "%s (~%lld rows)", zMsg, nRow);
    sqlite3VdbeAddOp4(v, OP_Explain, iId, iLevel, iFrom, zMsg, P4_DYNAMIC);
  }
}